

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg.c
# Opt level: O3

reg_t * reg_get_by_id(int id,int ver)

{
  reg_t *prVar1;
  reg_t *prVar2;
  list_t *plVar3;
  
  if ((((uint)ver < 9) && ((0x19cU >> (ver & 0x1fU) & 1) != 0)) &&
     (regs_v2_v3_v4_v7_v8[0].type != 0)) {
    prVar2 = regs_v2_v3_v4_v7_v8;
    do {
      if (prVar2->id == id) {
        return prVar2;
      }
      prVar1 = prVar2 + 1;
      prVar2 = prVar2 + 1;
    } while (prVar1->type != 0);
  }
  plVar3 = &regs_user;
  do {
    plVar3 = (list_t *)((list_node_t *)plVar3)->next;
    if ((list_node_t *)plVar3 == (list_node_t *)0x0) {
      return (reg_t *)0x0;
    }
  } while (((reg_t *)((list_node_t *)plVar3)->data)->id != id);
  return (reg_t *)((list_node_t *)plVar3)->data;
}

Assistant:

reg_t*
reg_get_by_id(
    int id,
    int ver
) {
    reg_t* table = reg_get_table(ver);
    if (table) {
        while(table->type) {
            if (table->id == id)
                return table;
            ++table;
        }
    }
    list_for_each(&regs_user, table) {
        if (table->id == id)
            return table;
    }
    return NULL;
}